

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O3

ostream * viennamath::operator<<
                    (ostream *stream,rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  ostream *poVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  iVar1 = (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[7])();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"expr",4);
  if ((char)iVar1 == '\0') {
    (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[3])(&local_38);
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_38,local_30);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
    (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[3])(&local_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)local_38,local_30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_expr<InterfaceType> const & e)
  {
    if (e.get()->is_unary())
    {
      stream << "expr"
            << "("
            << e.get()->deep_str()
            << ")";
    }
    else
    {
      stream << "expr"
            << e.get()->deep_str();
    }

    return stream;
  }